

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx_main.cpp
# Opt level: O0

int __thiscall ktx::Tools::main(Tools *this,int argc,char **argv)

{
  format_args args_00;
  string_view fmt;
  format_string<const_std::__cxx11::basic_string<char>_&> fmt_00;
  format_string<const_std::__cxx11::basic_string<char>_&> fmt_01;
  format_string<const_std::__cxx11::basic_string<char>_&,_char_*&> fmt_02;
  format_string<const_std::__cxx11::basic_string<char>_&,_const_std::__cxx11::basic_string<char>_&>
  fmt_03;
  bool bVar1;
  Options *this_00;
  bool *pbVar2;
  size_t sVar3;
  char *pcVar4;
  string *psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  long in_RDX;
  OptionAdder *in_RDI;
  exception *ex;
  ParseResult args;
  Options options;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  ParseResult *in_stack_fffffffffffff698;
  Options *in_stack_fffffffffffff6a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff6b0;
  unsigned_long_long in_stack_fffffffffffff6b8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_stack_fffffffffffff6c0;
  size_t *psVar6;
  undefined7 in_stack_fffffffffffff6c8;
  undefined1 in_stack_fffffffffffff6cf;
  ParseResult *in_stack_fffffffffffff6d0;
  char *in_stack_fffffffffffff6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6e0;
  OptionValue *in_stack_fffffffffffff6f0;
  Options *in_stack_fffffffffffff6f8;
  string *in_stack_fffffffffffff700;
  string *in_stack_fffffffffffff708;
  Options *in_stack_fffffffffffff710;
  allocator<char> *paVar7;
  int argc_00;
  string *arg_help;
  shared_ptr<const_cxxopts::Value> *value;
  string *desc;
  char *local_810;
  size_t local_808;
  char *local_800;
  size_t local_7f8;
  char *local_7f0;
  size_t local_7e8;
  string local_7e0 [32];
  char *local_7c0;
  size_t local_7b8;
  allocator<char> local_7a9;
  string local_7a8 [32];
  char *local_788;
  size_t local_780;
  allocator<char> local_771;
  string local_770 [32];
  Options *in_stack_fffffffffffff8b0;
  ostream *in_stack_fffffffffffff8b8;
  Tools *in_stack_fffffffffffff8c0;
  ParseResult local_648;
  allocator<char> local_589;
  string local_588 [71];
  allocator<char> local_541;
  string local_540 [39];
  allocator<char> local_519;
  string local_518 [39];
  allocator<char> local_4f1;
  string local_4f0 [71];
  allocator<char> local_4a9;
  string local_4a8 [39];
  allocator<char> local_481;
  string local_480 [39];
  allocator<char> local_459;
  string local_458 [71];
  allocator<char> local_411;
  string local_410 [39];
  undefined1 local_3e9 [40];
  undefined1 local_3c1 [80];
  undefined1 local_371 [40];
  undefined1 local_349 [56];
  allocator<char> local_311;
  string local_310 [32];
  Options local_2f0;
  long local_1c8;
  underlying_type_t<ktx::ReturnCode> local_1ac;
  char *local_198;
  char **local_190;
  undefined8 local_188;
  undefined1 *local_180;
  char *local_178;
  size_t local_170;
  undefined1 local_168 [32];
  undefined1 *local_148;
  string *local_140;
  string *local_138;
  char *local_130;
  size_t sStack_128;
  char *local_120;
  char **local_118;
  char *local_110;
  char **local_108;
  char *local_100;
  char **local_f8;
  char *local_f0;
  char **local_e8;
  char *local_e0;
  char **local_d8;
  char *local_d0;
  char **local_c8;
  char *local_c0;
  char **local_b8;
  char *local_b0;
  char **local_a8;
  char *local_a0;
  char **local_98;
  char **local_80;
  char *local_78;
  size_t sStack_70;
  undefined1 *local_60;
  undefined8 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined8 *local_38;
  char *local_30;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_1c8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  psVar5 = (string *)local_349;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  cxxopts::Options::Options
            (in_stack_fffffffffffff710,in_stack_fffffffffffff708,in_stack_fffffffffffff700);
  std::__cxx11::string::~string((string *)(local_349 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_349);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  desc = (string *)local_371;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  cxxopts::Options::custom_help(in_stack_fffffffffffff6a0,(string *)in_stack_fffffffffffff698);
  std::__cxx11::string::~string((string *)(local_371 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_371);
  cxxopts::Options::set_width(&local_2f0,100);
  value = (shared_ptr<const_cxxopts::Value> *)local_3c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  cxxopts::Options::add_options(in_stack_fffffffffffff6f8,(string *)in_stack_fffffffffffff6f0);
  arg_help = (string *)local_3e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<const_cxxopts::Value> *)in_stack_fffffffffffff6a0,
             (shared_ptr<cxxopts::Value> *)in_stack_fffffffffffff698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  cxxopts::OptionAdder::operator()(in_RDI,psVar5,desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<const_cxxopts::Value> *)in_stack_fffffffffffff6a0,
             (shared_ptr<cxxopts::Value> *)in_stack_fffffffffffff698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  this_00 = (Options *)cxxopts::OptionAdder::operator()(in_RDI,psVar5,desc,value,arg_help);
  argc_00 = (int)((ulong)&local_519 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  paVar7 = &local_541;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<const_cxxopts::Value> *)in_stack_fffffffffffff6a0,
             (shared_ptr<cxxopts::Value> *)in_stack_fffffffffffff698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  cxxopts::OptionAdder::operator()(in_RDI,psVar5,desc,value,arg_help);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator(&local_589);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x2aa1dc);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x2aa1e9);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_519);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x2aa244);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x2aa251);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_459);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x2aa2ac);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x2aa2b9);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator(&local_411);
  std::__cxx11::string::~string((string *)(local_3e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3e9);
  cxxopts::OptionAdder::~OptionAdder((OptionAdder *)0x2aa2fa);
  std::__cxx11::string::~string((string *)(local_3c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3c1);
  cxxopts::Options::allow_unrecognised_options(&local_2f0);
  cxxopts::ParseResult::ParseResult((ParseResult *)in_stack_fffffffffffff6c0.values_);
  cxxopts::Options::parse(this_00,argc_00,(char **)paVar7);
  cxxopts::ParseResult::operator=
            ((ParseResult *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
  cxxopts::ParseResult::~ParseResult((ParseResult *)in_stack_fffffffffffff6a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  cxxopts::ParseResult::operator[]
            (in_stack_fffffffffffff6d0,
             (string *)CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8));
  pbVar2 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffff6f0);
  in_RDI[1].m_group.field_2._M_local_buf[8] = *pbVar2 & 1;
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff8b8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8b7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
             (allocator<char> *)in_stack_fffffffffffff6d0);
  sVar3 = cxxopts::ParseResult::count
                    ((ParseResult *)CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
                     (string *)in_stack_fffffffffffff6c0.values_);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator(&local_771);
  if (sVar3 == 0) {
    paVar7 = &local_7a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
               (allocator<char> *)in_stack_fffffffffffff6d0);
    pcVar4 = (char *)cxxopts::ParseResult::count
                               ((ParseResult *)
                                CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
                                (string *)in_stack_fffffffffffff6c0.values_);
    std::__cxx11::string::~string(local_7a8);
    std::allocator<char>::~allocator(&local_7a9);
    if (pcVar4 == (char *)0x0) {
      cxxopts::ParseResult::unmatched_abi_cxx11_(&local_648);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(in_stack_fffffffffffff6b0);
      if (bVar1) {
        local_108 = &local_7f0;
        local_110 = "{}: Missing command.\n";
        local_c0 = "{}: Missing command.\n";
        local_7f0 = "{}: Missing command.\n";
        psVar6 = &local_7e8;
        local_b8 = local_108;
        sVar3 = std::char_traits<char>::length((char_type *)0x2aaf74);
        *psVar6 = sVar3;
        local_18 = local_110;
        psVar5 = cxxopts::Options::program_abi_cxx11_(&local_2f0);
        fmt_01.str_.size_ = sVar3;
        fmt_01.str_.data_ = (char *)psVar6;
        ::fmt::v10::print<std::__cxx11::string_const&>
                  ((ostream *)psVar5,fmt_01,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8));
        printUsage(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
      }
      else {
        if (**(char **)(local_1c8 + 8) == '-') {
          local_e8 = &local_810;
          local_f0 = "{}: Unrecognized argument: \"{}\"\n";
          local_e0 = "{}: Unrecognized argument: \"{}\"\n";
          local_810 = "{}: Unrecognized argument: \"{}\"\n";
          local_d8 = local_e8;
          local_808 = std::char_traits<char>::length((char_type *)0x2ab146);
          local_8 = local_f0;
          in_stack_fffffffffffff6a0 = (Options *)cxxopts::Options::program_abi_cxx11_(&local_2f0);
          this_01 = cxxopts::ParseResult::unmatched_abi_cxx11_(&local_648);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](this_01,0);
          fmt_03.str_.size_ = (size_t)paVar7;
          fmt_03.str_.data_ = pcVar4;
          ::fmt::v10::print<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((ostream *)in_stack_fffffffffffff700,fmt_03,
                     &in_stack_fffffffffffff6f8->m_program,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff6f0);
        }
        else {
          local_f8 = &local_800;
          local_100 = "{}: Unrecognized command: \"{}\"\n";
          local_d0 = "{}: Unrecognized command: \"{}\"\n";
          local_800 = "{}: Unrecognized command: \"{}\"\n";
          psVar6 = &local_7f8;
          local_c8 = local_f8;
          sVar3 = std::char_traits<char>::length((char_type *)0x2ab072);
          *psVar6 = sVar3;
          local_10 = local_100;
          cxxopts::Options::program_abi_cxx11_(&local_2f0);
          fmt_02.str_.size_ = (size_t)paVar7;
          fmt_02.str_.data_ = pcVar4;
          ::fmt::v10::print<std::__cxx11::string_const&,char*&>
                    ((ostream *)in_stack_fffffffffffff700,fmt_02,
                     &in_stack_fffffffffffff6f8->m_program,(char **)in_stack_fffffffffffff6f0);
        }
        printUsage(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
      }
      local_1ac = ktx::operator+(SUCCESS);
    }
    else {
      local_118 = &local_7c0;
      local_120 = "{} version: {}\n";
      local_b0 = "{} version: {}\n";
      local_7c0 = "{} version: {}\n";
      psVar6 = &local_7b8;
      local_a8 = local_118;
      sVar3 = std::char_traits<char>::length((char_type *)0x2aaca2);
      *psVar6 = sVar3;
      local_30 = local_120;
      psVar5 = cxxopts::Options::program_abi_cxx11_(&local_2f0);
      version_abi_cxx11_((bool)in_stack_fffffffffffff6cf);
      local_130 = local_7c0;
      sStack_128 = local_7b8;
      local_140 = local_7e0;
      local_138 = psVar5;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff6c0.values_);
      local_148 = local_168;
      local_80 = &local_130;
      local_178 = local_130;
      local_170 = sStack_128;
      local_58 = &local_188;
      local_40 = 0xdd;
      local_188 = 0xdd;
      fmt.data_._7_1_ = in_stack_fffffffffffff6cf;
      fmt.data_._0_7_ = in_stack_fffffffffffff6c8;
      fmt.size_ = (size_t)in_stack_fffffffffffff6d0;
      args_00.field_1.values_ = in_stack_fffffffffffff6c0.values_;
      args_00.desc_ = in_stack_fffffffffffff6b8;
      local_78 = local_178;
      sStack_70 = local_170;
      local_60 = local_148;
      local_50 = local_148;
      local_48 = local_148;
      local_38 = local_58;
      local_180 = local_148;
      ::fmt::v10::vprint(fmt,args_00);
      std::__cxx11::string::~string(local_7e0);
      local_1ac = ktx::operator+(SUCCESS);
    }
  }
  else {
    local_190 = &local_788;
    local_198 = 
    "{}: Unified CLI frontend for the KTX-Software library with sub-commands for specific operations.\n"
    ;
    local_a0 = 
    "{}: Unified CLI frontend for the KTX-Software library with sub-commands for specific operations.\n"
    ;
    local_788 = 
    "{}: Unified CLI frontend for the KTX-Software library with sub-commands for specific operations.\n"
    ;
    local_98 = local_190;
    local_780 = std::char_traits<char>::length((char_type *)0x2aaa90);
    local_20 = local_198;
    cxxopts::Options::program_abi_cxx11_(&local_2f0);
    fmt_00.str_.size_ = (size_t)in_stack_fffffffffffff6e0;
    fmt_00.str_.data_ = in_stack_fffffffffffff6d8;
    ::fmt::v10::print<std::__cxx11::string_const&>
              ((ostream *)in_stack_fffffffffffff6d0,fmt_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8));
    printUsage(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
    local_1ac = ktx::operator+(SUCCESS);
  }
  cxxopts::ParseResult::~ParseResult((ParseResult *)in_stack_fffffffffffff6a0);
  cxxopts::Options::~Options(in_stack_fffffffffffff6a0);
  return local_1ac;
}

Assistant:

int Tools::main(int argc, char* argv[]) {
    cxxopts::Options options("ktx", "");
    options.custom_help("[<command>] [OPTION...]");
    options.set_width(CONSOLE_USAGE_WIDTH);
    options.add_options()
            ("h,help", "Print this usage message and exit")
            ("v,version", "Print the version number of this program and exit")
            ("testrun", "Indicates test run. If enabled the tool will produce deterministic output whenever possible");

    options.allow_unrecognised_options();

    cxxopts::ParseResult args;
    try {
        args = options.parse(argc, argv);
    } catch (const std::exception& ex) {
        fmt::print(std::cerr, "{}: {}\n", options.program(), ex.what());
        printUsage(std::cerr, options);
        return +rc::INVALID_ARGUMENTS;
    }

    testrun = args["testrun"].as<bool>();

    if (args.count("help")) {
        fmt::print(std::cout, "{}: Unified CLI frontend for the KTX-Software library with sub-commands for specific operations.\n", options.program());
        printUsage(std::cout, options);
        return +rc::SUCCESS;
    }

    if (args.count("version")) {
        fmt::print("{} version: {}\n", options.program(), version(testrun));
        return +rc::SUCCESS;
    }

    if (args.unmatched().empty()) {
        fmt::print(std::cerr, "{}: Missing command.\n", options.program());
        printUsage(std::cerr, options);
    } else {
        if (argv[1][0] != '-') {
            fmt::print(std::cerr, "{}: Unrecognized command: \"{}\"\n", options.program(), argv[1]);
        } else {
            fmt::print(std::cerr, "{}: Unrecognized argument: \"{}\"\n", options.program(), args.unmatched()[0]);
        }
        printUsage(std::cerr, options);
    }

    return +rc::INVALID_ARGUMENTS;
}